

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cansniffer.c
# Opt level: O3

int handle_keyb(void)

{
  __u8 *p_Var1;
  byte *__s;
  byte cmd_00;
  int iVar2;
  ssize_t sVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  char cmd [25];
  uint local_60;
  undefined4 local_5c;
  byte local_58 [40];
  
  local_58[0x10] = 0;
  local_58[0x11] = 0;
  local_58[0x12] = 0;
  local_58[0x13] = 0;
  local_58[0x14] = 0;
  local_58[0x15] = 0;
  local_58[0x16] = 0;
  local_58[0x17] = 0;
  local_58[0x18] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[8] = 0;
  local_58[9] = 0;
  local_58[10] = 0;
  local_58[0xb] = 0;
  local_58[0xc] = 0;
  local_58[0xd] = 0;
  local_58[0xe] = 0;
  local_58[0xf] = 0;
  sVar3 = read(0,local_58,0x18);
  if (0x12 < sVar3) {
    return 1;
  }
  sVar4 = strlen((char *)local_58);
  if (sVar4 != 0) {
    local_58[sVar4 - 1] = 0;
  }
  __s = local_58 + 1;
  sVar4 = strlen((char *)__s);
  cmd_00 = local_58[0];
  if (0x4d < local_58[0]) {
    if (0x62 < local_58[0]) {
      switch(local_58[0]) {
      case 0x6e:
        lVar5 = (long)idx;
        if (lVar5 < 1) {
          clearscreen = 0;
          return 1;
        }
        lVar6 = 0;
        do {
          if ((*(uint *)(sniftab[0].current.data + lVar6 + -8) & 0xffff800) == 0) {
            p_Var1 = sniftab[0].last.data + lVar6 + -0x40;
            *p_Var1 = *p_Var1 & 0xfe;
          }
          lVar6 = lVar6 + 0x158;
        } while (lVar5 * 0x158 - lVar6 != 0);
        clearscreen = 0;
        return 1;
      case 0x6f:
      case 0x70:
      case 0x73:
      case 0x74:
      case 0x75:
      case 0x76:
        clearscreen = 0;
        return 1;
      case 0x71:
        running = 0;
        clearscreen = 0;
        return 1;
      case 0x72:
        iVar2 = readsettings((char *)__s);
        if (-1 < iVar2) {
          clearscreen = 0;
          return 1;
        }
        return 0;
      case 0x77:
        iVar2 = writesettings((char *)__s);
        if (iVar2 == 0) {
          clearscreen = 0;
          return 1;
        }
        return 0;
      }
      if (local_58[0] != 99) {
        clearscreen = 0;
        return 1;
      }
      if (color == '\x01') {
        color = 0;
        clearscreen = 0;
        return 1;
      }
      color = 1;
      clearscreen = 0;
      return 1;
    }
    if (local_58[0] == 0x4e) {
      lVar5 = (long)idx;
      if (lVar5 < 1) {
        clearscreen = 0;
        return 1;
      }
      lVar6 = 0;
      do {
        if (*(int *)(sniftab[0].current.data + lVar6 + -8) < 0) {
          p_Var1 = sniftab[0].last.data + lVar6 + -0x40;
          *p_Var1 = *p_Var1 & 0xfe;
        }
        lVar6 = lVar6 + 0x158;
      } while (lVar5 * 0x158 - lVar6 != 0);
      clearscreen = 0;
      return 1;
    }
    if (local_58[0] == 0x61) {
      lVar5 = (long)idx;
      if (lVar5 < 1) {
        clearscreen = 0;
        return 1;
      }
      lVar6 = 0;
      do {
        if ((*(uint *)(sniftab[0].current.data + lVar6 + -8) & 0xffff800) == 0) {
          p_Var1 = sniftab[0].last.data + lVar6 + -0x40;
          *p_Var1 = *p_Var1 | 1;
        }
        lVar6 = lVar6 + 0x158;
      } while (lVar5 * 0x158 - lVar6 != 0);
      clearscreen = 0;
      return 1;
    }
    if (local_58[0] != 0x62) {
      clearscreen = 0;
      return 1;
    }
LAB_00101e0d:
    if (binary != '\x01') {
      if (binary8 != '\x01') {
        binary = 1;
        binary_gap = 0;
        clearscreen = 0;
        return 1;
      }
      vdl = "|";
      binary = 1;
      binary_gap = 0;
      clearscreen = 0;
      return 1;
    }
    if (binary8 != '\x01') {
      binary = 0;
      binary_gap = 0;
      clearscreen = 0;
      return 1;
    }
    vdl = " | ";
    binary = 0;
    binary_gap = 0;
    clearscreen = 0;
    return 1;
  }
  if (local_58[0] < 0x2d) {
    if (local_58[0] < 0x2a) {
      if (local_58[0] == 0x20) {
        clearscreen = 0;
        return 1;
      }
      if (local_58[0] != 0x23) {
        clearscreen = 0;
        return 1;
      }
      clearscreen = 0;
      notch = 1;
      return 1;
    }
    if (local_58[0] == 0x2a) {
      lVar5 = (long)idx;
      if (lVar5 < 1) {
        clearscreen = 0;
        return 1;
      }
      sVar4 = 8;
      if (max_dlen != '\0') {
        sVar4 = 0x40;
      }
      lVar6 = 0;
      do {
        memset(sniftab[0].notch.data + lVar6,0,sVar4);
        lVar6 = lVar6 + 0x158;
      } while (lVar5 * 0x158 - lVar6 != 0);
      clearscreen = 0;
      return 1;
    }
    if (local_58[0] != 0x2b) {
      clearscreen = 0;
      return 1;
    }
  }
  else {
    if (0x3f < local_58[0]) {
      if (local_58[0] == 0x40) {
        print_ascii._0_1_ = (byte)print_ascii ^ 1;
        clearscreen = 0;
        return 1;
      }
      if (local_58[0] == 0x41) {
        lVar5 = (long)idx;
        if (lVar5 < 1) {
          clearscreen = 0;
          return 1;
        }
        lVar6 = 0;
        do {
          if (*(int *)(sniftab[0].current.data + lVar6 + -8) < 0) {
            p_Var1 = sniftab[0].last.data + lVar6 + -0x40;
            *p_Var1 = *p_Var1 | 1;
          }
          lVar6 = lVar6 + 0x158;
        } while (lVar5 * 0x158 - lVar6 != 0);
        clearscreen = 0;
        return 1;
      }
      if (local_58[0] != 0x42) {
        clearscreen = 0;
        return 1;
      }
      if (binary8 == '\x01') {
        vdl = " | ";
      }
      if (binary == '\x01') {
        binary = 0;
        binary_gap = 1;
        clearscreen = 0;
        return 1;
      }
      binary = 1;
      binary_gap = 1;
      clearscreen = 0;
      return 1;
    }
    if (local_58[0] != 0x2d) {
      if (local_58[0] != 0x38) {
        clearscreen = 0;
        return 1;
      }
      binary8 = '\x01';
      goto LAB_00101e0d;
    }
  }
  iVar2 = (int)sVar4;
  if (iVar2 < 8) {
    if (iVar2 == 3) {
LAB_001020b7:
      __isoc99_sscanf(__s,"%x",&local_60);
      uVar7 = local_60 | 0x80000000;
      if (iVar2 != 8) {
        uVar7 = local_60;
      }
      if ((long)idx < 1) {
        clearscreen = 0;
        return 1;
      }
      lVar5 = 0;
      do {
        if (*(uint *)(sniftab[0].current.data + lVar5 + -8) == uVar7) {
          uVar7 = *(uint *)(sniftab[0].last.data + lVar5 + -0x40);
          if (cmd_00 == 0x2b) {
            uVar7 = uVar7 | 1;
          }
          else {
            uVar7 = uVar7 & 0xfffffffe;
          }
          *(uint *)(sniftab[0].last.data + lVar5 + -0x40) = uVar7;
          clearscreen = 0;
          return 1;
        }
        lVar5 = lVar5 + 0x158;
      } while ((long)idx * 0x158 - lVar5 != 0);
      clearscreen = 0;
      return 1;
    }
    if (iVar2 != 6) {
      clearscreen = 0;
      return 1;
    }
    __isoc99_sscanf(__s,"%x",&local_60);
    uVar7 = local_60 | 0xffff800;
    local_60 = local_60 >> 0xc & 0x7ff;
  }
  else {
    if (iVar2 == 8) goto LAB_001020b7;
    if (iVar2 != 0x10) {
      clearscreen = 0;
      return 1;
    }
    __isoc99_sscanf(local_58 + 9,"%x",&local_5c);
    local_58[9] = 0;
    __isoc99_sscanf(__s,"%x",&local_60);
    uVar7 = local_5c | 0x80000000;
    local_60 = local_60 | 0x80000000;
    local_5c = uVar7;
  }
  do_modify_sniftab(local_60,uVar7,cmd_00);
  clearscreen = 0;
  return 1;
}

Assistant:

int handle_keyb(void)
{
	char cmd [25] = {0};
	int i, clen;
	unsigned int mask;
	unsigned int value;

	if (read(0, cmd, 24) > (long)strlen("+1234567812345678\n"))
		return 1; /* ignore */

	if (strlen(cmd) > 0)
		cmd[strlen(cmd)-1] = 0; /* chop off trailing newline */

	clen = strlen(&cmd[1]); /* content length behind command */

	switch (cmd[0]) {

	case '+':
	case '-':
		if (clen == 6) {
			/* masking strict SFF ID content vvvmmm */
			sscanf(&cmd[1], "%x", &value);
			mask = value | 0xFFFF800; /* cleared flags! */
			value >>= 12;
			value &= 0x7FF;
			do_modify_sniftab(value, mask, cmd[0]);
			break;
		} else if (clen == 16) {
			sscanf(&cmd[9], "%x", &mask);
			cmd[9] = 0; /* terminate 'value' */
			sscanf(&cmd[1], "%x", &value);
			mask |= CAN_EFF_FLAG;
			value |= CAN_EFF_FLAG;
			do_modify_sniftab(value, mask, cmd[0]);
			break;
		}

		/* check for single SFF/EFF CAN ID length */
		if (clen != 3 && clen != 8)
			break;

		/* enable/disable single SFF/EFF CAN ID */
		sscanf(&cmd[1], "%x", &value);
		if (clen == 8)
			value |= CAN_EFF_FLAG;

		i = sniftab_index(value);
		if (i < 0)
			break; /* No Match */

		if (cmd[0] == '+')
			do_set(i, ENABLE);
		else
			do_clr(i, ENABLE);

		break;

	case 'a' : /* all SFF CAN IDs */
		value = 0;
		mask = 0xFFFF800; /* cleared flags! */
		do_modify_sniftab(value, mask, '+');
		break;

	case 'n' : /* none SFF CAN IDs */
		value = 0;
		mask = 0xFFFF800; /* cleared flags! */
		do_modify_sniftab(value, mask, '-');
		break;

	case 'A' : /* all EFF CAN IDs */
		value = CAN_EFF_FLAG;
		mask = CAN_EFF_FLAG;
		do_modify_sniftab(value, mask, '+');
		break;

	case 'N' : /* none EFF CAN IDs */
		value = CAN_EFF_FLAG;
		mask = CAN_EFF_FLAG;
		do_modify_sniftab(value, mask, '-');
		break;

	case 'w' :
		if (writesettings(&cmd[1]))
			return 0;
		break;

	case 'r' :
		if (readsettings(&cmd[1]) < 0)
			return 0;
		break;

	case 'q' :
		running = 0;
		break;

	case '@' :
		/* toggle ASCII output */
		print_ascii ^= 1;
		break;

	case 'B' :
		binary_gap = 1;
		switchvdl(LDL);
		if (binary)
			binary = 0;
		else
			binary = 1;

		break;

	case '8' :
		binary8 = 1;
		/* fallthrough */

	case 'b' :
		binary_gap = 0;
		if (binary) {
			binary = 0;
			switchvdl(LDL);
		} else {
			binary = 1;
			switchvdl(SDL);
		}
		break;

	case 'c' :
		if (color)
			color = 0;
		else
			color = 1;

		break;

	case ' ' :
		clearscreen = 1;
		break;

	case '#' :
		notch = 1;
		break;

	case '*' :
		for (i = 0; i < idx; i++)
			memset(&sniftab[i].notch.data, 0, max_dlen);
		break;

	default:
		break;
	}

	clearscreen = 1;

	return 1; /* ok */
}